

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::reset
          (QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this,
          QNetworkRequestFactoryPrivate *ptr)

{
  bool bVar1;
  QNetworkRequestFactoryPrivate *this_00;
  QNetworkRequestFactoryPrivate *in_RSI;
  long in_FS_OFFSET;
  QNetworkRequestFactoryPrivate *old;
  totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*> *in_stack_ffffffffffffffb8;
  QNetworkRequestFactoryPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*> local_20;
  totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*> local_18;
  QNetworkRequestFactoryPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = Qt::operator!=<QNetworkRequestFactoryPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (local_10 != (QNetworkRequestFactoryPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x329d3f);
    }
    Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::totally_ordered_wrapper
              (&local_20,local_10);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate*>,Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*> *)0x329d5d);
    this_00 = Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::get(&local_18);
    if (((this_00 != (QNetworkRequestFactoryPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x329d83), !bVar1)) &&
       (this_00 != (QNetworkRequestFactoryPrivate *)0x0)) {
      QNetworkRequestFactoryPrivate::~QNetworkRequestFactoryPrivate(this_00);
      operator_delete(this_00,0x88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }